

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void QSslSocketPrivate::resetDefaultEllipticCurves(void)

{
  QTlsBackend *pQVar1;
  iterator iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QSslEllipticCurve local_6c;
  QArrayDataPointer<QSslEllipticCurve> local_68;
  QArrayDataPointer<int> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = tlsBackendInUse();
  if (pQVar1 != (QTlsBackend *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d._0_4_ = 0xaaaaaaaa;
    local_48.d._4_4_ = 0xaaaaaaaa;
    local_48.ptr._0_4_ = 0xaaaaaaaa;
    local_48.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_48,pQVar1);
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      local_68.d = (Data *)0x0;
      local_68.ptr = (QSslEllipticCurve *)0x0;
      local_68.size = 0;
      QList<QSslEllipticCurve>::reserve((QList<QSslEllipticCurve> *)&local_68,local_48.size);
      iVar2 = QList<int>::begin((QList<int> *)&local_48);
      iVar3 = QList<int>::end((QList<int> *)&local_48);
      for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
        local_6c.id = *iVar2.i;
        QList<QSslEllipticCurve>::emplaceBack<QSslEllipticCurve_const&>
                  ((QList<QSslEllipticCurve> *)&local_68,&local_6c);
      }
      setDefaultSupportedEllipticCurves((QList<QSslEllipticCurve> *)&local_68);
      QArrayDataPointer<QSslEllipticCurve>::~QArrayDataPointer(&local_68);
    }
    QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::resetDefaultEllipticCurves()
{
    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend)
        return;

    auto ids = tlsBackend->ellipticCurvesIds();
    if (!ids.size())
        return;

    QList<QSslEllipticCurve> curves;
    curves.reserve(ids.size());
    for (int id : ids) {
        QSslEllipticCurve curve;
        curve.id = id;
        curves.append(curve);
    }

    // Set the list of supported ECs, but not the list
    // of *default* ECs. OpenSSL doesn't like forcing an EC for the wrong
    // ciphersuite, so don't try it -- leave the empty list to mean
    // "the implementation will choose the most suitable one".
    setDefaultSupportedEllipticCurves(curves);
}